

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_debug.c
# Opt level: O0

char * debug_varname(GCproto *pt,BCPos pc,BCReg slot)

{
  uint uVar1;
  uint32_t uVar2;
  byte *pbVar3;
  int in_EDX;
  uint in_ESI;
  long in_RDI;
  bool bVar4;
  BCPos endpc;
  BCPos startpc;
  uint32_t vn;
  char *name;
  BCPos lastpc;
  char *p;
  int local_34;
  byte *local_30;
  uint local_24;
  byte *local_20;
  int local_18;
  uint local_14;
  byte *local_8;
  
  local_20 = (byte *)(ulong)*(uint *)(in_RDI + 0x3c);
  if (local_20 == (byte *)0x0) {
LAB_001160d2:
    local_8 = (byte *)0x0;
  }
  else {
    local_24 = 0;
    local_18 = in_EDX;
    local_14 = in_ESI;
    do {
      local_30 = local_20;
      uVar1 = (uint)*local_20;
      if (uVar1 < 7) {
        if (uVar1 == 0) goto LAB_001160d2;
      }
      else {
        do {
          local_20 = local_20 + 1;
        } while (*local_20 != 0);
      }
      local_20 = local_20 + 1;
      uVar2 = lj_buf_ruleb128((char **)&local_20);
      local_24 = local_24 + uVar2;
      if (local_14 < local_24) goto LAB_001160d2;
      uVar2 = lj_buf_ruleb128((char **)&local_20);
    } while ((local_24 + uVar2 <= local_14) ||
            (bVar4 = local_18 != 0, local_18 = local_18 + -1, bVar4));
    if (uVar1 < 7) {
      local_30 = (byte *)0x1c2420;
      local_34 = uVar1 - 1;
      if (local_34 != 0) {
        do {
          pbVar3 = local_30 + 1;
          bVar4 = true;
          if (*local_30 == 0) {
            local_34 = local_34 + -1;
            bVar4 = local_34 != 0;
          }
          local_30 = pbVar3;
        } while (bVar4);
      }
    }
    local_8 = local_30;
  }
  return (char *)local_8;
}

Assistant:

static const char *debug_varname(const GCproto *pt, BCPos pc, BCReg slot)
{
  const char *p = (const char *)proto_varinfo(pt);
  if (p) {
    BCPos lastpc = 0;
    for (;;) {
      const char *name = p;
      uint32_t vn = *(const uint8_t *)p;
      BCPos startpc, endpc;
      if (vn < VARNAME__MAX) {
	if (vn == VARNAME_END) break;  /* End of varinfo. */
      } else {
	do { p++; } while (*(const uint8_t *)p);  /* Skip over variable name. */
      }
      p++;
      lastpc = startpc = lastpc + lj_buf_ruleb128(&p);
      if (startpc > pc) break;
      endpc = startpc + lj_buf_ruleb128(&p);
      if (pc < endpc && slot-- == 0) {
	if (vn < VARNAME__MAX) {
#define VARNAMESTR(name, str)	str "\0"
	  name = VARNAMEDEF(VARNAMESTR);
#undef VARNAMESTR
	  if (--vn) while (*name++ || --vn) ;
	}
	return name;
      }
    }
  }
  return NULL;
}